

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Result * __thiscall
Catch::clara::detail::Parser::validate(Result *__return_storage_ptr__,Parser *this)

{
  pointer pOVar1;
  pointer pAVar2;
  Opt *opt;
  pointer pOVar3;
  pointer pAVar4;
  
  pOVar1 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pOVar3 = (this->m_options).
                super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
                ._M_impl.super__Vector_impl_data._M_start; pOVar3 != pOVar1; pOVar3 = pOVar3 + 1) {
    (*(pOVar3->super_ParserRefImpl<Catch::clara::detail::Opt>).
      super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase[2])
              (__return_storage_ptr__,pOVar3);
    if ((__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type != Ok) {
      return __return_storage_ptr__;
    }
    BasicResult<void>::~BasicResult(__return_storage_ptr__);
  }
  pAVar4 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pAVar4 == pAVar2) {
      (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type = Ok;
      (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
           (_func_int **)&PTR__BasicResult_00199400;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
      (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    (*(pAVar4->super_ParserRefImpl<Catch::clara::detail::Arg>).
      super_ComposableParserImpl<Catch::clara::detail::Arg>.super_ParserBase._vptr_ParserBase[2])
              (__return_storage_ptr__,pAVar4);
    if ((__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type != Ok) break;
    BasicResult<void>::~BasicResult(__return_storage_ptr__);
    pAVar4 = pAVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

auto validate() const -> Result override {
            for( auto const &opt : m_options ) {
                auto result = opt.validate();
                if( !result )
                    return result;
            }
            for( auto const &arg : m_args ) {
                auto result = arg.validate();
                if( !result )
                    return result;
            }
            return Result::ok();
        }